

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLEBTensorOp.cpp
# Opt level: O3

void __thiscall
amrex::MLEBTensorOp::apply
          (MLEBTensorOp *this,int amrlev,int mglev,MultiFab *out,MultiFab *in,BCMode bc_mode,
          StateMode s_mode,MLMGBndry *bndry)

{
  double *pdVar1;
  double *pdVar2;
  double *pdVar3;
  double *pdVar4;
  double *pdVar5;
  double *pdVar6;
  double *pdVar7;
  double *pdVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  pointer pVVar12;
  pointer puVar13;
  undefined1 auVar14 [16];
  FabType FVar15;
  int iVar16;
  uint uVar17;
  long lVar18;
  int *piVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  long lVar29;
  long lVar30;
  long lVar31;
  int iVar32;
  int iVar33;
  long lVar34;
  long lVar35;
  int iVar36;
  long lVar37;
  int iVar38;
  long lVar39;
  long lVar40;
  long lVar41;
  long lVar42;
  long lVar43;
  long lVar44;
  long lVar45;
  long lVar46;
  long lVar47;
  int iVar48;
  int iVar49;
  long lVar50;
  long lVar51;
  long lVar52;
  ulong uVar53;
  ulong uVar54;
  undefined4 uVar55;
  undefined4 uVar56;
  double dVar57;
  double dVar58;
  double dVar59;
  double dVar60;
  double dVar61;
  double dVar62;
  double dVar63;
  double dVar64;
  undefined1 auVar65 [16];
  double dVar66;
  double dVar67;
  double dVar68;
  double dVar69;
  double dVar70;
  double dVar71;
  double dVar72;
  double dVar73;
  double dVar74;
  double dVar75;
  double dVar76;
  double dVar77;
  long local_ac8;
  Real dzi;
  FabArray<amrex::EBCellFlagFab> *local_a38;
  Real dyi;
  double local_988;
  double local_980;
  Box local_944;
  double local_928;
  undefined8 uStack_920;
  Real dxi;
  undefined8 uStack_910;
  double local_908;
  double dStack_900;
  double local_8f8;
  double dStack_8f0;
  double *local_8e8;
  double dStack_8e0;
  long local_8d0;
  MultiCutFab *local_8c8;
  FabArray<amrex::FArrayBox> *local_8c0;
  FabArray<amrex::FArrayBox> *local_8b8;
  FabArray<amrex::FArrayBox> *local_8b0;
  long local_8a8;
  int *local_8a0;
  int *local_898;
  int *local_890;
  long local_888;
  long local_880;
  long local_878;
  long local_870;
  long local_868;
  long local_860;
  long local_858;
  double *local_850;
  Long local_848;
  long local_840;
  Long local_838;
  long local_830;
  long local_828;
  double *local_820;
  Long local_818;
  Long local_810;
  long local_808;
  double *local_800;
  long local_7f8;
  EBCellFlag *local_7f0;
  double *local_7e8;
  double *local_7e0;
  double local_7d8;
  double dStack_7d0;
  double local_7c8;
  double dStack_7c0;
  double local_7b8;
  double dStack_7b0;
  MultiCutFab *local_7a8;
  MultiCutFab *pMStack_7a0;
  MultiCutFab *local_798;
  MultiCutFab *local_788;
  MultiCutFab *pMStack_780;
  MultiCutFab *local_778;
  Real dzi_1;
  Real dyi_1;
  FabArray<amrex::FArrayBox> *local_760;
  FabArray<amrex::IArrayBox> *local_758;
  FabArray<amrex::FArrayBox> *local_750;
  FabArray<amrex::FArrayBox> *local_748;
  FabArray<amrex::FArrayBox> *local_740;
  ulong local_738;
  long local_730;
  ulong local_728;
  EBCellFlag *local_720;
  long local_718;
  long local_710;
  long local_708;
  long local_700;
  int *local_6f8;
  long local_6f0;
  long local_6e8;
  long local_6e0;
  double *local_6d8;
  int *local_6d0;
  double *local_6c8;
  double *local_6c0;
  int *local_6b8;
  long local_6b0;
  ulong local_6a8;
  double *local_6a0;
  double *local_698;
  double *local_690;
  double *local_688;
  long local_680;
  long local_678;
  long local_670;
  long local_668;
  long local_660;
  long local_658;
  double *local_650;
  double *local_648;
  long local_640;
  long local_638;
  long local_630;
  long local_628;
  long local_620;
  long local_618;
  long local_610;
  long local_608;
  double *local_600;
  double *local_5f8;
  _Head_base<0UL,_amrex::MultiFab_*,_false> local_5f0;
  double *local_5e8;
  long local_5e0;
  long local_5d8;
  long local_5d0;
  double *local_5c8;
  double *local_5c0;
  double *local_5b8;
  long local_5b0;
  long local_5a8;
  double *local_5a0;
  double local_598;
  double local_590;
  double local_588;
  long local_580;
  Array4<const_double> fzfab;
  Array4<const_double> fyfab;
  Array4<const_double> fxfab;
  Array4<double> axfab;
  Array4<const_double> local_478;
  double local_438;
  double dStack_430;
  Real dxi_1;
  undefined8 uStack_420;
  undefined1 local_418 [16];
  double local_408;
  double dStack_400;
  double local_3f8;
  undefined8 uStack_3f0;
  Array4<const_double> local_3e8;
  Array4<const_double> local_3a8;
  Array4<const_double> local_368;
  Array4<const_double> local_328;
  Array4<const_double> local_2e8;
  Array4<const_double> local_2a8;
  Array4<const_double> local_268;
  Array4<const_double> local_228;
  Array4<const_double> local_1e8;
  Array4<const_amrex::EBCellFlag> local_1a8;
  Array4<const_int> local_168;
  Array4<const_double> local_128;
  Array4<const_double> local_e8;
  MFIter mfi;
  MFItInfo local_44;
  
  local_8b0 = &out->super_FabArray<amrex::FArrayBox>;
  MLEBABecLap::apply(&this->super_MLEBABecLap,amrlev,mglev,out,in,bc_mode,s_mode,bndry);
  lVar50 = (long)mglev;
  lVar23 = (long)amrlev;
  pVVar12 = (this->m_kappa).
            super_vector<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
            .
            super__Vector_base<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  lVar18 = ((long)*(pointer *)
                   ((long)&pVVar12[lVar23].
                           super_vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
                           .
                           super__Vector_base<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
                   + 8) -
            *(long *)&pVVar12[lVar23].
                      super_vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
                      .
                      super__Vector_base<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
           >> 7) * -0x71c71c71c71c71c7;
  if (lVar18 - lVar50 != 0 && lVar50 <= lVar18) {
    local_8d0 = lVar23;
    applyBCTensor(this,amrlev,mglev,in,bc_mode,s_mode,bndry);
    lVar18 = *(long *)(*(long *)&(this->super_MLEBABecLap).super_MLCellABecLap.super_MLCellLinOp.
                                 super_MLLinOp.m_factory.
                                 super_vector<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
                                 .
                                 super__Vector_base<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[lVar23].
                                 super_vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
                                 .
                                 super__Vector_base<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
                      + lVar50 * 8);
    if ((lVar18 == 0) ||
       (lVar18 = __dynamic_cast(lVar18,&FabFactory<amrex::FArrayBox>::typeinfo,
                                &EBFArrayBoxFactory::typeinfo,0), lVar18 == 0)) {
      local_788 = (MultiCutFab *)0x0;
      pMStack_780 = (MultiCutFab *)0x0;
      local_778 = (MultiCutFab *)0x0;
      local_8c0 = (FabArray<amrex::FArrayBox> *)0x0;
      local_798 = (MultiCutFab *)0x0;
      local_7a8 = (MultiCutFab *)0x0;
      pMStack_7a0 = (MultiCutFab *)0x0;
      local_a38 = (FabArray<amrex::EBCellFlagFab> *)0x0;
      local_8c8 = (MultiCutFab *)0x0;
    }
    else {
      local_a38 = EBDataCollection::getMultiEBCellFlagFab(*(EBDataCollection **)(lVar18 + 0xd8));
      local_8c0 = &EBDataCollection::getVolFrac(*(EBDataCollection **)(lVar18 + 0xd8))->
                   super_FabArray<amrex::FArrayBox>;
      EBDataCollection::getAreaFrac(*(EBDataCollection **)(lVar18 + 0xd8));
      EBDataCollection::getFaceCent(*(EBDataCollection **)(lVar18 + 0xd8));
      local_8c8 = EBDataCollection::getBndryCent(*(EBDataCollection **)(lVar18 + 0xd8));
    }
    lVar18 = *(long *)&(this->super_MLEBABecLap).super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp
                       .m_geom.
                       super_vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                       .
                       super__Vector_base<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[local_8d0].
                       super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                       super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>;
    lVar23 = lVar50 * 200;
    dxi = *(Real *)(lVar18 + 0x38 + lVar23);
    uStack_910 = 0;
    dVar9 = *(double *)(lVar18 + 0x40 + lVar23);
    dVar10 = *(double *)(lVar18 + 0x48 + lVar23);
    local_8b8 = (FabArray<amrex::FArrayBox> *)
                (lVar50 * 0x480 +
                *(long *)&(this->m_tauflux).
                          super_vector<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
                          .
                          super__Vector_base<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[local_8d0].
                          super_vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
                          .
                          super__Vector_base<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
                );
    local_758 = (FabArray<amrex::IArrayBox> *)
                (*(long *)&(this->super_MLEBABecLap).m_cc_mask.
                           super_vector<amrex::Vector<amrex::iMultiFab,_std::allocator<amrex::iMultiFab>_>,_std::allocator<amrex::Vector<amrex::iMultiFab,_std::allocator<amrex::iMultiFab>_>_>_>
                           .
                           super__Vector_base<amrex::Vector<amrex::iMultiFab,_std::allocator<amrex::iMultiFab>_>,_std::allocator<amrex::Vector<amrex::iMultiFab,_std::allocator<amrex::iMultiFab>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[local_8d0].
                           super_vector<amrex::iMultiFab,_std::allocator<amrex::iMultiFab>_>.
                           super__Vector_base<amrex::iMultiFab,_std::allocator<amrex::iMultiFab>_> +
                lVar50 * 0x180);
    local_760 = *(FabArray<amrex::FArrayBox> **)
                 (*(long *)&(this->super_MLEBABecLap).m_eb_b_coeffs.
                            super_vector<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
                            .
                            super__Vector_base<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[local_8d0].
                            super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                            .
                            super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                 + lVar50 * 8);
    local_750 = (FabArray<amrex::FArrayBox> *)
                (lVar50 * 0x180 +
                *(long *)&(this->m_eb_kappa).
                          super_vector<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>,_std::allocator<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>_>_>
                          .
                          super__Vector_base<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>,_std::allocator<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[local_8d0].
                          super_vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>.
                          super__Vector_base<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>);
    dVar11 = (this->super_MLEBABecLap).m_b_scalar;
    compCrossTerms(this,amrlev,mglev,in);
    local_44.num_streams = Gpu::Device::max_gpu_streams;
    local_44.do_tiling = true;
    local_44.tilesize.vect[0] = (int)FabArrayBase::mfiter_tile_size;
    local_44.tilesize.vect[1] = FabArrayBase::mfiter_tile_size._4_4_;
    local_44.tilesize.vect[2] = DAT_00810ec0;
    local_44.dynamic = true;
    local_44.device_sync = true;
    MFIter::MFIter(&mfi,&local_8b0->super_FabArrayBase,&local_44);
    if (mfi.currentIndex < mfi.endIndex) {
      local_740 = local_8b8 + 1;
      local_748 = local_8b8 + 2;
      dxi_1 = dxi * dVar11;
      uStack_420 = uStack_910;
      dyi_1 = dVar9 * dVar11;
      dzi_1 = dVar10 * dVar11;
      local_418._8_4_ = SUB84(dxi,0);
      local_418._0_8_ = dxi;
      local_418._12_4_ = (int)((ulong)dxi >> 0x20);
      do {
        MFIter::tilebox(&local_944,&mfi);
        FVar15 = regular;
        if (local_a38 == (FabArray<amrex::EBCellFlagFab> *)0x0) {
LAB_006fa2d4:
          FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>(&axfab,local_8b0,&mfi);
          FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>(&fxfab,local_8b8,&mfi);
          FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>(&fyfab,local_740,&mfi);
          FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>(&fzfab,local_748,&mfi);
          if (FVar15 == regular) {
            if (local_944.smallend.vect[2] <= local_944.bigend.vect[2]) {
              local_7b8 = (double)((long)local_944.smallend.vect[0] * 8);
              iVar32 = local_944.smallend.vect[2];
              do {
                if (local_944.smallend.vect[1] <= local_944.bigend.vect[1]) {
                  lVar50 = (long)fyfab.begin.x;
                  lVar27 = (long)fzfab.begin.x;
                  lVar28 = (long)axfab.begin.x;
                  lVar29 = (iVar32 - axfab.begin.z) * axfab.kstride;
                  local_8e8 = axfab.p + (long)local_944.smallend.vect[0] +
                                        ((lVar29 + axfab.nstride * 2) - lVar28);
                  lVar25 = (long)(iVar32 - fzfab.begin.z) * fzfab.kstride * 8;
                  lVar21 = fzfab.kstride * 8 * (long)((iVar32 + 1) - fzfab.begin.z);
                  local_8f8 = (double)((long)fzfab.p +
                                      lVar25 + fzfab.nstride * 8 + lVar27 * -8 + (long)local_7b8);
                  local_928 = (double)((long)fzfab.p +
                                      fzfab.nstride * 0x10 + lVar21 + lVar27 * -8 + (long)local_7b8)
                  ;
                  local_908 = (double)((long)fzfab.p +
                                      lVar21 + fzfab.nstride * 8 + lVar27 * -8 + (long)local_7b8);
                  lVar20 = (iVar32 - fyfab.begin.z) * fyfab.kstride;
                  lVar18 = lVar20 * 8 + lVar50 * -8 + (long)local_7b8;
                  lVar23 = fyfab.nstride * 8 + lVar20 * 8 + lVar50 * -8 + (long)local_7b8;
                  lVar50 = fyfab.nstride * 0x10 + lVar20 * 8 + lVar50 * -8 + (long)local_7b8;
                  lVar26 = (iVar32 - fxfab.begin.z) * fxfab.kstride;
                  lVar24 = (long)fxfab.begin.x;
                  lVar20 = (long)local_944.smallend.vect[1];
                  do {
                    iVar38 = (int)lVar20;
                    if (local_944.smallend.vect[0] <= local_944.bigend.vect[0]) {
                      lVar37 = (lVar20 - fxfab.begin.y) * fxfab.jstride * 8;
                      lVar39 = (lVar20 - fzfab.begin.y) * fzfab.jstride * 8;
                      lVar46 = (lVar20 - axfab.begin.y) * axfab.jstride * 8;
                      lVar30 = lVar46 + lVar29 * 8 + lVar28 * -8 + (long)local_7b8;
                      lVar31 = lVar46 + axfab.nstride * 8 + lVar29 * 8 + lVar28 * -8 +
                                        (long)local_7b8;
                      lVar44 = (long)((iVar38 + 1) - fyfab.begin.y) * fyfab.jstride * 8;
                      lVar40 = (lVar20 - fyfab.begin.y) * fyfab.jstride * 8;
                      lVar34 = lVar37 + lVar26 * 8 + lVar24 * -8 + (long)local_7b8;
                      lVar35 = lVar37 + fxfab.nstride * 8 + lVar26 * 8 + lVar24 * -8 +
                                        (long)local_7b8;
                      lVar37 = lVar37 + fxfab.nstride * 0x10 + lVar26 * 8 + lVar24 * -8 +
                                        (long)local_7b8;
                      lVar51 = 0;
                      do {
                        *(double *)((long)axfab.p + lVar51 * 8 + lVar30) =
                             (*(double *)
                               ((long)fzfab.p +
                               lVar51 * 8 + lVar39 + lVar21 + lVar27 * -8 + (long)local_7b8) -
                             *(double *)
                              ((long)fzfab.p +
                              lVar51 * 8 + lVar39 + lVar25 + lVar27 * -8 + (long)local_7b8)) * dzi_1
                             + (*(double *)((long)fxfab.p + lVar51 * 8 + lVar34 + 8) -
                               *(double *)((long)fxfab.p + lVar51 * 8 + lVar34)) * dxi_1 +
                               (*(double *)((long)fyfab.p + lVar51 * 8 + lVar44 + lVar18) -
                               *(double *)((long)fyfab.p + lVar51 * 8 + lVar40 + lVar18)) * dyi_1 +
                             *(double *)((long)axfab.p + lVar51 * 8 + lVar30);
                        *(double *)((long)axfab.p + lVar51 * 8 + lVar31) =
                             (*(double *)((long)local_908 + lVar39 + lVar51 * 8) -
                             *(double *)((long)local_8f8 + lVar39 + lVar51 * 8)) * dzi_1 +
                             (*(double *)((long)fxfab.p + lVar51 * 8 + lVar35 + 8) -
                             *(double *)((long)fxfab.p + lVar51 * 8 + lVar35)) * dxi_1 +
                             (*(double *)((long)fyfab.p + lVar51 * 8 + lVar44 + lVar23) -
                             *(double *)((long)fyfab.p + lVar51 * 8 + lVar40 + lVar23)) * dyi_1 +
                             *(double *)((long)axfab.p + lVar51 * 8 + lVar31);
                        *(double *)((long)local_8e8 + lVar51 * 8 + lVar46) =
                             (*(double *)((long)local_928 + lVar39 + lVar51 * 8) -
                             *(double *)
                              ((long)fzfab.p +
                              lVar51 * 8 +
                              lVar39 + lVar25 + fzfab.nstride * 0x10 + lVar27 * -8 + (long)local_7b8
                              )) * dzi_1 +
                             (*(double *)((long)fxfab.p + lVar51 * 8 + lVar37 + 8) -
                             *(double *)((long)fxfab.p + lVar51 * 8 + lVar37)) * dxi_1 +
                             (*(double *)((long)fyfab.p + lVar51 * 8 + lVar44 + lVar50) -
                             *(double *)((long)fyfab.p + lVar51 * 8 + lVar40 + lVar50)) * dyi_1 +
                             *(double *)((long)local_8e8 + lVar51 * 8 + lVar46);
                        lVar51 = lVar51 + 1;
                      } while ((local_944.bigend.vect[0] - local_944.smallend.vect[0]) + 1 !=
                               (int)lVar51);
                    }
                    lVar20 = lVar20 + 1;
                  } while (iVar38 + 1 != local_944.bigend.vect[1] + 1U);
                }
                iVar32 = iVar32 + 1;
              } while (iVar32 != local_944.bigend.vect[2] + 1);
            }
          }
          else {
            FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                      (&local_2e8,&in->super_FabArray<amrex::FArrayBox>,&mfi);
            FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>(&local_e8,local_760,&mfi);
            FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>(&local_128,local_750,&mfi);
            FabArray<amrex::IArrayBox>::const_array<amrex::IArrayBox,_0>(&local_168,local_758,&mfi);
            FabArray<amrex::EBCellFlagFab>::const_array<amrex::EBCellFlagFab,_0>
                      (&local_1a8,local_a38,&mfi);
            FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>(&local_1e8,local_8c0,&mfi);
            MultiCutFab::const_array(&local_228,local_788,&mfi);
            MultiCutFab::const_array(&local_268,pMStack_780,&mfi);
            MultiCutFab::const_array(&local_2a8,local_778,&mfi);
            MultiCutFab::const_array(&local_328,local_7a8,&mfi);
            MultiCutFab::const_array(&local_368,pMStack_7a0,&mfi);
            MultiCutFab::const_array(&local_3a8,local_798,&mfi);
            MultiCutFab::const_array(&local_3e8,local_8c8,&mfi);
            puVar13 = (this->super_MLEBABecLap).m_eb_phi.
                      super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                      .
                      super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            local_5f0._M_head_impl =
                 *(MultiFab **)
                  &(puVar13->_M_t).
                   super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>;
            iVar32 = (this->super_MLEBABecLap).m_is_eb_inhomog;
            if (iVar32 == 0 ||
                (tuple<amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>)
                local_5f0._M_head_impl == (_Head_base<0UL,_amrex::MultiFab_*,_false>)0x0) {
              local_478.kstride = 0;
              local_478.nstride = 0;
              local_478.p = (double *)0x0;
              local_478.jstride = 0;
              local_478.begin.x = 1;
              local_478.begin.y = 1;
              local_478.begin.z = 1;
              local_478.end.x = 0;
              local_478.end.y = 0;
              local_478.end.z = 0;
              local_478.ncomp = 0;
            }
            else {
              FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                        (&local_478,
                         (FabArray<amrex::FArrayBox> *)
                         puVar13[local_8d0]._M_t.
                         super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>
                         ,&mfi);
            }
            if (local_944.smallend.vect[2] <= local_944.bigend.vect[2]) {
              local_728 = (ulong)(uint)local_944.bigend.vect[0];
              local_738 = (ulong)(uint)local_944.bigend.vect[1];
              local_730 = (long)local_944.smallend.vect[1];
              local_8a8 = (long)local_944.smallend.vect[0];
              iVar38 = local_944.smallend.vect[2];
              do {
                if (local_944.smallend.vect[1] <= local_944.bigend.vect[1]) {
                  local_708 = (long)local_1a8.begin.y;
                  local_710 = local_1a8.jstride;
                  local_718 = (long)iVar38;
                  local_720 = local_1a8.p + (local_718 - local_1a8.begin.z) * local_1a8.kstride;
                  iVar16 = iVar38 + 1;
                  local_ac8 = local_730;
                  do {
                    if (local_944.smallend.vect[0] <= local_944.bigend.vect[0]) {
                      lVar24 = (local_ac8 - local_228.begin.y) * local_228.jstride;
                      lVar34 = (local_718 - local_228.begin.z) * local_228.kstride;
                      local_800 = local_328.p +
                                  (local_ac8 - local_328.begin.y) * local_328.jstride +
                                  (local_718 - local_328.begin.z) * local_328.kstride;
                      lVar37 = (local_718 - local_268.begin.z) * local_268.kstride;
                      lVar39 = (local_ac8 - local_268.begin.y) * local_268.jstride;
                      lVar18 = (local_718 - local_368.begin.z) * local_368.kstride;
                      local_688 = local_368.p +
                                  (local_ac8 - local_368.begin.y) * local_368.jstride + lVar18;
                      local_700 = local_ac8 + 1;
                      lVar46 = (local_700 - local_268.begin.y) * local_268.jstride;
                      local_690 = local_368.p +
                                  (local_700 - local_368.begin.y) * local_368.jstride + lVar18;
                      lVar23 = (iVar38 - fzfab.begin.z) * fzfab.kstride;
                      lVar44 = (iVar38 - local_2a8.begin.z) * local_2a8.kstride;
                      lVar40 = (iVar16 - fzfab.begin.z) * fzfab.kstride;
                      lVar25 = (iVar16 - local_2a8.begin.z) * local_2a8.kstride;
                      lVar18 = (local_ac8 - local_3a8.begin.y) * local_3a8.jstride;
                      local_698 = local_3a8.p +
                                  lVar18 + (local_718 - local_3a8.begin.z) * local_3a8.kstride;
                      local_6a0 = local_3a8.p +
                                  lVar18 + ((long)iVar16 - (long)local_3a8.begin.z) *
                                           local_3a8.kstride;
                      local_5a0 = local_1e8.p +
                                  (local_ac8 - local_1e8.begin.y) * local_1e8.jstride +
                                  (local_718 - local_1e8.begin.z) * local_1e8.kstride;
                      local_6d8 = local_478.p +
                                  (local_ac8 - local_478.begin.y) * local_478.jstride +
                                  (local_718 - local_478.begin.z) * local_478.kstride;
                      local_7e8 = local_3e8.p +
                                  (local_ac8 - local_3e8.begin.y) * local_3e8.jstride +
                                  (local_718 - local_3e8.begin.z) * local_3e8.kstride;
                      local_5f8 = local_128.p +
                                  (local_ac8 - local_128.begin.y) * local_128.jstride +
                                  (local_718 - local_128.begin.z) * local_128.kstride;
                      local_600 = local_e8.p +
                                  (local_ac8 - local_e8.begin.y) * local_e8.jstride +
                                  (local_718 - local_e8.begin.z) * local_e8.kstride;
                      lVar26 = (local_ac8 - axfab.begin.y) * axfab.jstride;
                      lVar35 = (local_718 - axfab.begin.z) * axfab.kstride;
                      lVar27 = (local_ac8 - fyfab.begin.y) * fyfab.jstride;
                      local_7e0 = fyfab.p + (local_700 - fyfab.begin.y) * fyfab.jstride;
                      local_7f0 = local_720 + (local_ac8 - local_708) * local_1a8.jstride;
                      local_808 = (long)fxfab.begin.y;
                      local_810 = fxfab.jstride;
                      lVar28 = (local_ac8 - local_808) * fxfab.jstride;
                      local_7f8 = (iVar38 - fxfab.begin.z) * fxfab.kstride;
                      local_820 = fxfab.p;
                      lVar51 = (long)local_168.begin.x;
                      local_6a8 = (ulong)(uint)~local_168.begin.x;
                      lVar52 = (iVar38 - local_168.begin.z) * local_168.kstride;
                      local_828 = (long)local_168.begin.y;
                      lVar29 = (local_ac8 - local_828) * local_168.jstride;
                      local_830 = (long)fyfab.begin.z;
                      local_5a8 = (iVar38 - fyfab.begin.z) * fyfab.kstride;
                      iVar48 = (int)local_ac8;
                      local_898 = local_168.p + (~local_168.begin.y + iVar48) * local_168.jstride;
                      local_8a0 = local_168.p + (local_700 - local_828) * local_168.jstride;
                      local_840 = (long)fzfab.begin.y;
                      local_848 = fzfab.jstride;
                      lVar30 = (local_ac8 - local_840) * fzfab.jstride;
                      local_850 = fzfab.p;
                      lVar31 = (local_ac8 - local_2a8.begin.y) * local_2a8.jstride;
                      local_858 = (~local_168.begin.z + iVar38) * local_168.kstride;
                      local_6b0 = (local_718 - local_168.begin.z) * local_168.kstride;
                      local_6e0 = local_478.nstride;
                      local_6e8 = local_478.nstride * 0x10;
                      local_618 = local_3e8.nstride;
                      local_620 = local_3e8.nstride * 0x10;
                      local_628 = (long)local_2e8.begin.y;
                      local_630 = local_2e8.jstride;
                      local_640 = local_2e8.kstride;
                      local_638 = (iVar38 - local_2e8.begin.z) * local_2e8.kstride;
                      local_648 = local_2e8.p;
                      local_650 = local_2e8.p + (local_ac8 - local_628) * local_2e8.jstride;
                      local_5b0 = axfab.nstride * 0x10;
                      local_818 = fxfab.kstride;
                      local_5b8 = fxfab.p + lVar28 + (local_718 - fxfab.begin.z) * fxfab.kstride;
                      local_838 = fyfab.kstride;
                      lVar18 = (local_718 - local_830) * fyfab.kstride;
                      local_5c0 = fyfab.p + ((int)local_700 - fyfab.begin.y) * fyfab.jstride +
                                            lVar18;
                      local_5c8 = fyfab.p + lVar27 + lVar18;
                      lVar50 = (long)fxfab.begin.x;
                      local_860 = (long)local_328.begin.x;
                      local_868 = local_328.nstride;
                      lVar20 = (long)fyfab.begin.x;
                      local_5d0 = (long)local_268.begin.x;
                      local_870 = (long)local_368.begin.x;
                      local_878 = local_368.nstride;
                      local_6b8 = local_898 + lVar52;
                      local_890 = local_168.p + lVar29 + lVar52;
                      local_6f8 = local_8a0 + lVar52;
                      lVar21 = (long)fzfab.begin.x;
                      local_5d8 = (long)local_2a8.begin.x;
                      local_880 = (long)local_3a8.begin.x;
                      local_6c0 = fzfab.p + lVar30 + lVar23;
                      local_6c8 = fzfab.p + lVar30 + lVar40;
                      local_888 = local_3a8.nstride;
                      local_6d0 = local_168.p + lVar29 + local_6b0;
                      local_5e0 = (long)local_1e8.begin.x;
                      local_6f0 = (long)local_478.begin.x;
                      local_658 = (long)local_3e8.begin.x;
                      local_660 = (long)local_2e8.begin.x;
                      local_668 = local_2e8.nstride;
                      local_670 = local_2e8.nstride * 2;
                      local_678 = (long)local_128.begin.x;
                      local_680 = (long)local_e8.begin.x;
                      local_5e8 = axfab.p + lVar26 + lVar35 + axfab.nstride * 2;
                      local_608 = local_168.kstride;
                      local_610 = local_168.jstride;
                      lVar18 = local_8a8;
                      do {
                        uVar17 = local_7f0[lVar18 - local_1a8.begin.x].flag & 3;
                        iVar49 = (int)lVar18;
                        if (uVar17 == 0) {
                          lVar22 = (long)((iVar49 + 1) - fxfab.begin.x);
                          pdVar1 = local_5b8 + (lVar18 - lVar50);
                          pdVar2 = local_5c0 + (lVar18 - lVar20);
                          pdVar3 = local_5c8 + (lVar18 - lVar20);
                          pdVar4 = fzfab.p + lVar30 + (lVar18 - lVar21) + lVar40;
                          pdVar5 = fzfab.p + lVar30 + (lVar18 - lVar21) + lVar23;
                          lVar41 = lVar18 - axfab.begin.x;
                          axfab.p[lVar26 + lVar35 + lVar41] =
                               ((*pdVar4 - *pdVar5) * dVar10 +
                               (local_5b8[lVar22] - *pdVar1) * dxi + (*pdVar2 - *pdVar3) * dVar9) *
                               dVar11 + axfab.p[lVar26 + lVar35 + lVar41];
                          axfab.p[lVar26 + lVar35 + lVar41 + axfab.nstride] =
                               ((pdVar4[fzfab.nstride] - pdVar5[fzfab.nstride]) * dVar10 +
                               (local_5b8[lVar22 + fxfab.nstride] - pdVar1[fxfab.nstride]) * dxi +
                               (pdVar2[fyfab.nstride] - pdVar3[fyfab.nstride]) * dVar9) * dVar11 +
                               axfab.p[lVar26 + lVar35 + lVar41 + axfab.nstride];
                          axfab.p[lVar26 + lVar35 + lVar41 + axfab.nstride * 2] =
                               ((pdVar4[fzfab.nstride * 2] - pdVar5[fzfab.nstride * 2]) * dVar10 +
                               (local_5b8[lVar22 + fxfab.nstride * 2] - pdVar1[fxfab.nstride * 2]) *
                               dxi + (pdVar2[fyfab.nstride * 2] - pdVar3[fyfab.nstride * 2]) * dVar9
                               ) * dVar11 + axfab.p[lVar26 + lVar35 + lVar41 + axfab.nstride * 2];
                        }
                        else if (uVar17 == 1) {
                          lVar22 = lVar18 - lVar50;
                          pdVar1 = fxfab.p + lVar28 + lVar22 + local_7f8;
                          lVar41 = lVar18 - local_228.begin.x;
                          dVar60 = local_228.p[lVar24 + lVar34 + lVar41];
                          dVar74 = *pdVar1;
                          local_8e8 = (double *)pdVar1[fxfab.nstride * 2];
                          dStack_8e0 = pdVar1[fxfab.nstride];
                          if ((0.0 < dVar60) && (dVar60 < 1.0)) {
                            dVar58 = local_800[lVar18 - local_860];
                            iVar36 = (-(uint)(dVar58 < 0.0) | 1) + iVar48;
                            dVar57 = (local_800 + (lVar18 - local_860))[local_328.nstride];
                            lVar42 = (long)(~local_168.begin.x + iVar49);
                            lVar43 = (iVar36 - local_168.begin.y) * local_168.jstride;
                            if ((local_168.p[lVar43 + lVar42 + lVar52] == 0) &&
                               (local_168.p[lVar43 + (lVar18 - lVar51) + lVar52] == 0)) {
                              uVar55 = 0;
                              uVar56 = 0;
                            }
                            else {
                              dVar58 = ABS(dVar58);
                              uVar55 = SUB84(dVar58,0);
                              uVar56 = (undefined4)((ulong)dVar58 >> 0x20);
                            }
                            iVar33 = (-(uint)(dVar57 < 0.0) | 1) + iVar38;
                            lVar43 = (iVar33 - local_168.begin.z) * local_168.kstride;
                            if ((local_168.p[lVar29 + lVar42 + lVar43] == 0) &&
                               (local_168.p[lVar29 + (lVar18 - lVar51) + lVar43] == 0)) {
                              dVar57 = 0.0;
                            }
                            else {
                              dVar57 = ABS(dVar57);
                            }
                            dVar58 = 1.0 - (double)CONCAT44(uVar56,uVar55);
                            dVar61 = dVar58 * (1.0 - dVar57);
                            dVar67 = (1.0 - dVar57) * (double)CONCAT44(uVar56,uVar55);
                            lVar42 = (iVar36 - fxfab.begin.y) * fxfab.jstride;
                            pdVar1 = fxfab.p + lVar42 + lVar22 + local_7f8;
                            dVar58 = dVar58 * dVar57;
                            lVar43 = (iVar33 - fxfab.begin.z) * fxfab.kstride;
                            pdVar2 = fxfab.p + lVar28 + lVar22 + lVar43;
                            dVar57 = (double)CONCAT44(uVar56,uVar55) * dVar57;
                            pdVar3 = fxfab.p + lVar42 + lVar22 + lVar43;
                            dVar74 = *pdVar3 * dVar57 +
                                     *pdVar2 * dVar58 + dVar74 * dVar61 + *pdVar1 * dVar67;
                            local_8e8 = (double *)
                                        (pdVar3[fxfab.nstride * 2] * dVar57 +
                                        pdVar2[fxfab.nstride * 2] * dVar58 +
                                        dVar61 * (double)local_8e8 +
                                        pdVar1[fxfab.nstride * 2] * dVar67);
                            dStack_8e0 = pdVar3[fxfab.nstride] * dVar57 +
                                         pdVar2[fxfab.nstride] * dVar58 +
                                         dVar61 * dStack_8e0 + pdVar1[fxfab.nstride] * dVar67;
                          }
                          lVar22 = lVar18 + 1;
                          lVar42 = lVar22 - lVar50;
                          pdVar1 = fxfab.p + lVar28 + lVar42 + local_7f8;
                          local_580 = lVar22 - local_228.begin.x;
                          local_928 = local_228.p[lVar24 + lVar34 + local_580];
                          local_588 = *pdVar1;
                          local_7b8 = pdVar1[fxfab.nstride * 2];
                          dStack_7b0 = pdVar1[fxfab.nstride];
                          if ((0.0 < local_928) && (local_928 < 1.0)) {
                            dVar58 = local_800[lVar22 - local_860];
                            iVar36 = (-(uint)(dVar58 < 0.0) | 1) + iVar48;
                            dVar57 = (local_800 + (lVar22 - local_860))[local_328.nstride];
                            lVar43 = (iVar36 - local_168.begin.y) * local_168.jstride;
                            if ((local_168.p[lVar43 + (lVar18 - lVar51) + lVar52] == 0) &&
                               (local_168.p[lVar43 + (lVar22 - lVar51) + lVar52] == 0)) {
                              uVar55 = 0;
                              uVar56 = 0;
                            }
                            else {
                              dVar58 = ABS(dVar58);
                              uVar55 = SUB84(dVar58,0);
                              uVar56 = (undefined4)((ulong)dVar58 >> 0x20);
                            }
                            iVar33 = (-(uint)(dVar57 < 0.0) | 1) + iVar38;
                            lVar43 = (iVar33 - local_168.begin.z) * local_168.kstride;
                            if ((local_168.p[lVar29 + (lVar18 - lVar51) + lVar43] == 0) &&
                               (local_168.p[lVar29 + (lVar22 - lVar51) + lVar43] == 0)) {
                              dVar57 = 0.0;
                            }
                            else {
                              dVar57 = ABS(dVar57);
                            }
                            dVar58 = 1.0 - (double)CONCAT44(uVar56,uVar55);
                            dVar61 = dVar58 * (1.0 - dVar57);
                            dVar67 = (1.0 - dVar57) * (double)CONCAT44(uVar56,uVar55);
                            lVar22 = (iVar36 - fxfab.begin.y) * fxfab.jstride;
                            pdVar1 = fxfab.p + lVar22 + lVar42 + local_7f8;
                            dVar58 = dVar58 * dVar57;
                            lVar43 = (iVar33 - fxfab.begin.z) * fxfab.kstride;
                            pdVar2 = fxfab.p + lVar28 + lVar42 + lVar43;
                            dVar57 = (double)CONCAT44(uVar56,uVar55) * dVar57;
                            pdVar3 = fxfab.p + lVar22 + lVar42 + lVar43;
                            local_588 = *pdVar3 * dVar57 +
                                        *pdVar2 * dVar58 + local_588 * dVar61 + *pdVar1 * dVar67;
                            local_7b8 = pdVar3[fxfab.nstride * 2] * dVar57 +
                                        pdVar2[fxfab.nstride * 2] * dVar58 +
                                        dVar61 * local_7b8 + pdVar1[fxfab.nstride * 2] * dVar67;
                            dStack_7b0 = pdVar3[fxfab.nstride] * dVar57 +
                                         pdVar2[fxfab.nstride] * dVar58 +
                                         dVar61 * dStack_7b0 + pdVar1[fxfab.nstride] * dVar67;
                          }
                          lVar22 = lVar18 - lVar20;
                          pdVar1 = fyfab.p + lVar27 + lVar22 + local_5a8;
                          lVar42 = lVar18 - local_5d0;
                          local_7d8 = local_268.p[lVar39 + lVar37 + lVar42];
                          local_980 = *pdVar1;
                          local_8f8 = pdVar1[fyfab.nstride * 2];
                          dStack_8f0 = pdVar1[fyfab.nstride];
                          dStack_7d0 = 0.0;
                          if ((0.0 < local_7d8) && (local_7d8 < 1.0)) {
                            dVar58 = local_688[lVar18 - local_870];
                            iVar36 = (-(uint)(dVar58 < 0.0) | 1) + iVar49;
                            dVar57 = (local_688 + (lVar18 - local_870))[local_368.nstride];
                            iVar33 = iVar36 - local_168.begin.x;
                            if ((local_6b8[iVar33] == 0) && (local_890[iVar33] == 0)) {
                              uVar55 = 0;
                              uVar56 = 0;
                            }
                            else {
                              dVar58 = ABS(dVar58);
                              uVar55 = SUB84(dVar58,0);
                              uVar56 = (undefined4)((ulong)dVar58 >> 0x20);
                            }
                            iVar33 = (-(uint)(dVar57 < 0.0) | 1) + iVar38;
                            lVar43 = (iVar33 - local_168.begin.z) * local_168.kstride;
                            if ((local_898[(lVar18 - lVar51) + lVar43] == 0) &&
                               (local_168.p[lVar29 + (lVar18 - lVar51) + lVar43] == 0)) {
                              dVar57 = 0.0;
                            }
                            else {
                              dVar57 = ABS(dVar57);
                            }
                            dVar58 = 1.0 - (double)CONCAT44(uVar56,uVar55);
                            dVar61 = dVar58 * (1.0 - dVar57);
                            dVar67 = (1.0 - dVar57) * (double)CONCAT44(uVar56,uVar55);
                            lVar43 = iVar36 - lVar20;
                            pdVar1 = fyfab.p + lVar27 + lVar43 + local_5a8;
                            dVar58 = dVar58 * dVar57;
                            lVar47 = (iVar33 - fyfab.begin.z) * fyfab.kstride;
                            pdVar2 = fyfab.p + lVar27 + lVar22 + lVar47;
                            dVar57 = (double)CONCAT44(uVar56,uVar55) * dVar57;
                            pdVar3 = fyfab.p + lVar27 + lVar43 + lVar47;
                            local_980 = *pdVar3 * dVar57 +
                                        *pdVar2 * dVar58 + local_980 * dVar61 + *pdVar1 * dVar67;
                            local_8f8 = pdVar3[fyfab.nstride * 2] * dVar57 +
                                        pdVar2[fyfab.nstride * 2] * dVar58 +
                                        dVar61 * local_8f8 + pdVar1[fyfab.nstride * 2] * dVar67;
                            dStack_8f0 = pdVar3[fyfab.nstride] * dVar57 +
                                         pdVar2[fyfab.nstride] * dVar58 +
                                         dVar61 * dStack_8f0 + pdVar1[fyfab.nstride] * dVar67;
                          }
                          pdVar1 = local_7e0 + lVar22 + local_5a8;
                          dVar58 = local_268.p[lVar46 + lVar37 + lVar42];
                          local_590 = *pdVar1;
                          local_908 = pdVar1[fyfab.nstride * 2];
                          dStack_900 = pdVar1[fyfab.nstride];
                          if ((0.0 < dVar58) && (dVar58 < 1.0)) {
                            dVar57 = local_690[lVar18 - local_870];
                            iVar36 = (-(uint)(dVar57 < 0.0) | 1) + iVar49;
                            dVar61 = (local_690 + (lVar18 - local_870))[local_368.nstride];
                            iVar33 = iVar36 - local_168.begin.x;
                            if ((local_890[iVar33] == 0) && (local_6f8[iVar33] == 0)) {
                              uVar55 = 0;
                              uVar56 = 0;
                            }
                            else {
                              dVar57 = ABS(dVar57);
                              uVar55 = SUB84(dVar57,0);
                              uVar56 = (undefined4)((ulong)dVar57 >> 0x20);
                            }
                            iVar33 = (-(uint)(dVar61 < 0.0) | 1) + iVar38;
                            lVar43 = (iVar33 - local_168.begin.z) * local_168.kstride;
                            if ((local_168.p[lVar29 + (lVar18 - lVar51) + lVar43] == 0) &&
                               (local_8a0[(lVar18 - lVar51) + lVar43] == 0)) {
                              dVar61 = 0.0;
                            }
                            else {
                              dVar61 = ABS(dVar61);
                            }
                            dVar57 = 1.0 - (double)CONCAT44(uVar56,uVar55);
                            dVar67 = dVar57 * (1.0 - dVar61);
                            dVar68 = (1.0 - dVar61) * (double)CONCAT44(uVar56,uVar55);
                            iVar36 = iVar36 - fyfab.begin.x;
                            pdVar1 = local_7e0 + iVar36 + local_5a8;
                            dVar57 = dVar57 * dVar61;
                            lVar43 = (iVar33 - fyfab.begin.z) * fyfab.kstride;
                            pdVar2 = local_7e0 + lVar22 + lVar43;
                            dVar61 = (double)CONCAT44(uVar56,uVar55) * dVar61;
                            pdVar3 = local_7e0 + iVar36 + lVar43;
                            local_590 = *pdVar3 * dVar61 +
                                        *pdVar2 * dVar57 + local_590 * dVar67 + *pdVar1 * dVar68;
                            local_908 = pdVar3[fyfab.nstride * 2] * dVar61 +
                                        pdVar2[fyfab.nstride * 2] * dVar57 +
                                        dVar67 * local_908 + pdVar1[fyfab.nstride * 2] * dVar68;
                            dStack_900 = pdVar3[fyfab.nstride] * dVar61 +
                                         pdVar2[fyfab.nstride] * dVar57 +
                                         dVar67 * dStack_900 + pdVar1[fyfab.nstride] * dVar68;
                          }
                          lVar22 = lVar18 - lVar21;
                          lVar43 = lVar18 - local_5d8;
                          dVar57 = local_2a8.p[lVar31 + lVar43 + lVar44];
                          local_988 = fzfab.p[lVar30 + lVar22 + lVar23];
                          local_7c8 = fzfab.p[lVar30 + lVar22 + lVar23 + fzfab.nstride * 2];
                          dStack_7c0 = fzfab.p[lVar30 + lVar22 + lVar23 + fzfab.nstride];
                          if ((0.0 < dVar57) && (dVar57 < 1.0)) {
                            dVar61 = local_698[lVar18 - local_880];
                            iVar36 = (-(uint)(dVar61 < 0.0) | 1) + iVar49;
                            dVar67 = (local_698 + (lVar18 - local_880))[local_3a8.nstride];
                            lVar47 = (long)(iVar36 - local_168.begin.x);
                            if ((local_168.p[lVar29 + lVar47 + local_858] == 0) &&
                               (local_168.p[lVar29 + lVar47 + lVar52] == 0)) {
                              dVar61 = 0.0;
                            }
                            else {
                              dVar61 = ABS(dVar61);
                            }
                            iVar33 = (-(uint)(dVar67 < 0.0) | 1) + iVar48;
                            lVar47 = (iVar33 - local_828) * local_168.jstride;
                            if ((local_168.p[lVar47 + (lVar18 - lVar51) + local_858] == 0) &&
                               (local_168.p[lVar47 + (lVar18 - lVar51) + lVar52] == 0)) {
                              dVar67 = 0.0;
                            }
                            else {
                              dVar67 = ABS(dVar67);
                            }
                            dVar69 = (1.0 - dVar61) * (1.0 - dVar67);
                            dVar71 = (1.0 - dVar67) * dVar61;
                            lVar45 = iVar36 - lVar21;
                            pdVar1 = local_6c0 + lVar45;
                            dVar68 = (1.0 - dVar61) * dVar67;
                            lVar47 = (iVar33 - fzfab.begin.y) * fzfab.jstride;
                            dVar61 = dVar61 * dVar67;
                            local_988 = fzfab.p[lVar47 + lVar45 + lVar23] * dVar61 +
                                        fzfab.p[lVar47 + lVar22 + lVar23] * dVar68 +
                                        local_988 * dVar69 + *pdVar1 * dVar71;
                            local_7c8 = fzfab.p[lVar47 + lVar45 + lVar23 + fzfab.nstride * 2] *
                                        dVar61 + fzfab.p[lVar47 + lVar22 + lVar23 + fzfab.nstride *
                                                                                    2] * dVar68 +
                                                 dVar69 * local_7c8 +
                                                 pdVar1[fzfab.nstride * 2] * dVar71;
                            dStack_7c0 = fzfab.p[lVar47 + lVar45 + lVar23 + fzfab.nstride] * dVar61
                                         + fzfab.p[lVar47 + lVar22 + lVar23 + fzfab.nstride] *
                                           dVar68 + dVar69 * dStack_7c0 +
                                                    pdVar1[fzfab.nstride] * dVar71;
                          }
                          dVar61 = local_2a8.p[lVar31 + lVar43 + lVar25];
                          dVar67 = fzfab.p[lVar30 + lVar22 + lVar40];
                          dVar68 = fzfab.p[lVar30 + lVar22 + lVar40 + fzfab.nstride * 2];
                          dVar69 = fzfab.p[lVar30 + lVar22 + lVar40 + fzfab.nstride];
                          if ((0.0 < dVar61) && (dVar61 < 1.0)) {
                            dVar71 = local_6a0[lVar18 - local_880];
                            dVar59 = (local_6a0 + (lVar18 - local_880))[local_3a8.nstride];
                            iVar36 = (-(uint)(dVar59 < 0.0) | 1) + iVar48;
                            iVar33 = (-(uint)(dVar71 < 0.0) | 1) + iVar49;
                            lVar45 = (long)(iVar33 - fzfab.begin.x);
                            pdVar1 = local_6c8 + lVar45;
                            lVar47 = (iVar36 - fzfab.begin.y) * fzfab.jstride;
                            auVar65._0_4_ = -(uint)(local_6d0[iVar33 - local_168.begin.x] == 0);
                            auVar65._4_4_ = -(uint)(local_6d0[iVar33 - local_168.begin.x] == 0);
                            auVar65._8_4_ =
                                 -(uint)(local_168.p
                                         [(iVar36 - local_828) * local_168.jstride +
                                          (lVar18 - lVar51) + local_6b0] == 0);
                            auVar65._12_4_ =
                                 -(uint)(local_168.p
                                         [(iVar36 - local_828) * local_168.jstride +
                                          (lVar18 - lVar51) + local_6b0] == 0);
                            auVar14._8_8_ = ABS(dVar59);
                            auVar14._0_8_ = ABS(dVar71);
                            dVar62 = SUB168(~auVar65 & auVar14,0);
                            dVar63 = SUB168(~auVar65 & auVar14,8);
                            dVar70 = (1.0 - dVar62) * (1.0 - dVar63);
                            dVar59 = (1.0 - dVar63) * dVar62;
                            dVar71 = (1.0 - dVar62) * dVar63;
                            dVar62 = dVar62 * dVar63;
                            dVar67 = fzfab.p[lVar47 + lVar45 + lVar40] * dVar62 +
                                     fzfab.p[lVar47 + lVar22 + lVar40] * dVar71 +
                                     dVar67 * dVar70 + *pdVar1 * dVar59;
                            dVar68 = fzfab.p[lVar47 + lVar45 + lVar40 + fzfab.nstride * 2] * dVar62
                                     + fzfab.p[lVar47 + lVar22 + lVar40 + fzfab.nstride * 2] *
                                       dVar71 + dVar70 * dVar68 + pdVar1[fzfab.nstride * 2] * dVar59
                            ;
                            dVar69 = fzfab.p[lVar47 + lVar45 + lVar40 + fzfab.nstride] * dVar62 +
                                     fzfab.p[lVar47 + lVar22 + lVar40 + fzfab.nstride] * dVar71 +
                                     dVar70 * dVar69 + pdVar1[fzfab.nstride] * dVar59;
                          }
                          dVar71 = local_5a0[lVar18 - local_5e0];
                          if (local_5f0._M_head_impl == (MultiFab *)0x0) {
                            dVar58 = 0.0;
                            dVar57 = 0.0;
                            dVar60 = 0.0;
                          }
                          else {
                            if (iVar32 == 0) {
                              local_438 = 0.0;
                              dStack_430 = 0.0;
                              uVar55 = 0;
                              uVar56 = 0;
                            }
                            else {
                              lVar22 = lVar18 - local_6f0;
                              uVar55 = SUB84(local_6d8[lVar22],0);
                              uVar56 = (undefined4)((ulong)local_6d8[lVar22] >> 0x20);
                              local_438 = local_6d8[lVar22 + local_478.nstride * 2];
                              dStack_430 = local_6d8[lVar22 + local_478.nstride];
                            }
                            local_928 = local_928 - dVar60;
                            dVar61 = dVar61 - dVar57;
                            local_7d8 = dVar58 - local_7d8;
                            local_408 = 1.0 / SQRT(dVar61 * dVar61 +
                                                   local_928 * local_928 + local_7d8 * local_7d8);
                            dVar57 = -local_928 * local_408;
                            dVar58 = local_408 * -dVar61;
                            local_408 = local_408 * -local_7d8;
                            dVar60 = (dVar71 * dVar71 + -0.25) / (dVar71 + dVar71);
                            if (dVar60 <= 0.3) {
                              dVar60 = 0.3;
                            }
                            dVar59 = ABS(local_408);
                            if (ABS(local_408) <= ABS(dVar57)) {
                              dVar59 = ABS(dVar57);
                            }
                            dVar62 = ABS(dVar58);
                            if (ABS(dVar58) <= dVar59) {
                              dVar62 = dVar59;
                            }
                            dVar60 = dVar60 / dVar62;
                            lVar22 = lVar18 - local_658;
                            dVar62 = local_7e8[lVar22] - dVar60 * dVar57;
                            dVar59 = 1.0 / dVar60;
                            local_3f8 = (double)CONCAT44(uVar56,uVar55);
                            uStack_3f0 = 0;
                            if (dVar57 <= 0.0) {
                              dVar62 = -dVar62;
                            }
                            dVar63 = local_7e8[lVar22 + local_3e8.nstride * 2] - dVar60 * dVar58;
                            dVar70 = local_7e8[lVar22 + local_3e8.nstride] - dVar60 * local_408;
                            uVar53 = -(ulong)(0.0 < dVar58);
                            uVar54 = -(ulong)(0.0 < local_408);
                            dVar60 = (double)(~uVar53 & (ulong)-dVar63 | (ulong)dVar63 & uVar53);
                            dVar70 = (double)(~uVar54 & (ulong)-dVar70 | (ulong)dVar70 & uVar54);
                            dVar64 = dVar62 * dVar60;
                            dVar66 = dVar62 * dVar70;
                            dVar75 = dVar70 * dVar60;
                            dVar73 = dVar66 * dVar60;
                            dVar76 = dVar62 + 1.0 + dVar70 + dVar60 + dVar66 + dVar64 + dVar75 +
                                     dVar73;
                            lVar22 = lVar18 - local_660;
                            pdVar1 = local_650 + lVar22 + local_638;
                            dVar63 = ((-dVar60 - dVar64) - dVar75) - dVar73;
                            lVar45 = (int)((((uint)uVar53 | 1) + iVar38) - local_2e8.begin.z) *
                                     local_2e8.kstride;
                            pdVar2 = local_650 + lVar22 + lVar45;
                            dVar60 = ((-dVar70 - dVar66) - dVar75) - dVar73;
                            lVar47 = (int)((((uint)uVar54 | 1) + iVar48) - local_2e8.begin.y) *
                                     local_2e8.jstride;
                            pdVar3 = local_2e8.p + lVar47 + lVar22 + local_638;
                            dVar75 = dVar75 + dVar73;
                            pdVar4 = local_2e8.p + lVar47 + lVar22 + lVar45;
                            dVar72 = ((-dVar62 - dVar66) - dVar64) - dVar73;
                            lVar22 = (long)(int)(~local_2e8.begin.x +
                                                iVar49 + (uint)(dVar57 <= 0.0) * 2);
                            pdVar5 = local_650 + lVar22 + local_638;
                            dVar64 = dVar64 + dVar73;
                            pdVar6 = local_650 + lVar22 + lVar45;
                            dVar66 = dVar66 + dVar73;
                            pdVar7 = local_2e8.p + lVar47 + lVar22 + local_638;
                            pdVar8 = local_2e8.p + lVar47 + lVar22 + lVar45;
                            dVar62 = local_600[lVar18 - local_680];
                            dVar77 = (local_3f8 -
                                     ((*pdVar7 * dVar66 +
                                      *pdVar6 * dVar64 +
                                      *pdVar5 * dVar72 +
                                      *pdVar4 * dVar75 +
                                      *pdVar3 * dVar60 + *pdVar1 * dVar76 + *pdVar2 * dVar63) -
                                     *pdVar8 * dVar73)) * dVar59;
                            dVar70 = dVar59 * (local_438 -
                                              ((pdVar7[local_2e8.nstride * 2] * dVar66 +
                                               pdVar6[local_2e8.nstride * 2] * dVar64 +
                                               pdVar5[local_2e8.nstride * 2] * dVar72 +
                                               pdVar4[local_2e8.nstride * 2] * dVar75 +
                                               pdVar3[local_2e8.nstride * 2] * dVar60 +
                                               pdVar1[local_2e8.nstride * 2] * dVar76 +
                                               pdVar2[local_2e8.nstride * 2] * dVar63) -
                                              pdVar8[local_2e8.nstride * 2] * dVar73));
                            dVar59 = dVar59 * (dStack_430 -
                                              ((pdVar7[local_2e8.nstride] * dVar66 +
                                               pdVar6[local_2e8.nstride] * dVar64 +
                                               pdVar5[local_2e8.nstride] * dVar72 +
                                               pdVar4[local_2e8.nstride] * dVar75 +
                                               pdVar3[local_2e8.nstride] * dVar60 +
                                               pdVar1[local_2e8.nstride] * dVar76 +
                                               pdVar2[local_2e8.nstride] * dVar63) -
                                              pdVar8[local_2e8.nstride] * dVar73));
                            dVar63 = (dVar62 * -0.6666666666666666 + local_5f8[lVar18 - local_678])
                                     * (dVar57 * dVar77 + dVar59 * local_408 + dVar70 * dVar58);
                            dVar60 = (dVar57 * dVar70 * dVar62 * dVar61 +
                                     (dVar57 * dVar77 * dVar62 + dVar63) * local_928 +
                                     dVar57 * dVar59 * dVar62 * local_7d8) * dxi;
                            dVar58 = (dVar61 * (dVar70 * dVar58 * dVar62 + dVar63) +
                                     local_928 * dVar62 * dVar77 * dVar58 +
                                     local_7d8 * dVar59 * dVar58 * dVar62) * (double)local_418._0_8_
                            ;
                            dVar57 = (dVar61 * local_408 * dVar70 * dVar62 +
                                     local_928 * dVar62 * dVar77 * local_408 +
                                     local_7d8 * (dVar59 * local_408 * dVar62 + dVar63)) *
                                     (double)local_418._8_8_;
                            dStack_7d0 = local_7d8;
                            local_598 = dVar67;
                            dStack_400 = local_408;
                          }
                          uStack_920 = 0;
                          dVar71 = dVar11 / dVar71;
                          lVar22 = lVar18 - axfab.begin.x;
                          axfab.p[lVar26 + lVar35 + lVar22] =
                               (dVar60 * dxi +
                               (dVar67 * local_2a8.p[lVar31 + lVar43 + lVar25] -
                               local_988 * local_2a8.p[lVar31 + lVar43 + lVar44]) * dVar10 +
                               (local_588 * local_228.p[lVar24 + lVar34 + local_580] -
                               dVar74 * local_228.p[lVar24 + lVar34 + lVar41]) * dxi +
                               (local_590 * local_268.p[lVar46 + lVar37 + lVar42] -
                               local_980 * local_268.p[lVar39 + lVar37 + lVar42]) * dVar9) * dVar71
                               + axfab.p[lVar26 + lVar35 + lVar22];
                          axfab.p[lVar26 + lVar35 + lVar22 + axfab.nstride] =
                               (dVar57 * dxi +
                               (dVar69 * local_2a8.p[lVar31 + lVar43 + lVar25] -
                               dStack_7c0 * local_2a8.p[lVar31 + lVar43 + lVar44]) * dVar10 +
                               (dStack_7b0 * local_228.p[lVar24 + lVar34 + local_580] -
                               dStack_8e0 * local_228.p[lVar24 + lVar34 + lVar41]) * dxi +
                               (dStack_900 * local_268.p[lVar46 + lVar37 + lVar42] -
                               dStack_8f0 * local_268.p[lVar39 + lVar37 + lVar42]) * dVar9) * dVar71
                               + axfab.p[lVar26 + lVar35 + lVar22 + axfab.nstride];
                          local_5e8[lVar22] =
                               (dVar58 * dxi +
                               (dVar68 * local_2a8.p[lVar31 + lVar43 + lVar25] -
                               local_7c8 * local_2a8.p[lVar31 + lVar43 + lVar44]) * dVar10 +
                               (local_7b8 * local_228.p[lVar24 + lVar34 + local_580] -
                               (double)local_8e8 * local_228.p[lVar24 + lVar34 + lVar41]) * dxi +
                               (local_908 * local_268.p[lVar46 + lVar37 + lVar42] -
                               local_8f8 * local_268.p[lVar39 + lVar37 + lVar42]) * dVar9) * dVar71
                               + local_5e8[lVar22];
                        }
                        lVar18 = lVar18 + 1;
                      } while (local_944.bigend.vect[0] + 1U != (int)lVar18);
                    }
                    local_ac8 = local_ac8 + 1;
                  } while (local_944.bigend.vect[1] + 1U != (int)local_ac8);
                }
                iVar38 = iVar38 + 1;
              } while (iVar38 != local_944.bigend.vect[2] + 1);
            }
          }
        }
        else {
          piVar19 = &mfi.currentIndex;
          if (mfi.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
            piVar19 = ((mfi.local_index_map)->super_vector<int,_std::allocator<int>_>).
                      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                      _M_start + mfi.currentIndex;
          }
          FVar15 = EBCellFlagFab::getType
                             ((local_a38->m_fabs_v).
                              super__Vector_base<amrex::EBCellFlagFab_*,_std::allocator<amrex::EBCellFlagFab_*>_>
                              ._M_impl.super__Vector_impl_data._M_start[*piVar19],&local_944);
          if (FVar15 != covered) goto LAB_006fa2d4;
        }
        MFIter::operator++(&mfi);
      } while (mfi.currentIndex < mfi.endIndex);
    }
    MFIter::~MFIter(&mfi);
  }
  return;
}

Assistant:

void
MLEBTensorOp::apply (int amrlev, int mglev, MultiFab& out, MultiFab& in, BCMode bc_mode,
                     StateMode s_mode, const MLMGBndry* bndry) const
{
    BL_PROFILE("MLEBTensorOp::apply()");
    MLEBABecLap::apply(amrlev, mglev, out, in, bc_mode, s_mode, bndry);

    if (mglev >= m_kappa[amrlev].size()) return;

    applyBCTensor(amrlev, mglev, in, bc_mode, s_mode, bndry);

    auto factory = dynamic_cast<EBFArrayBoxFactory const*>(m_factory[amrlev][mglev].get());
    const FabArray<EBCellFlagFab>* flags = (factory) ? &(factory->getMultiEBCellFlagFab()) : nullptr;
    const MultiFab* vfrac = (factory) ? &(factory->getVolFrac()) : nullptr;
    auto area = (factory) ? factory->getAreaFrac()
        : Array<const MultiCutFab*,AMREX_SPACEDIM>{AMREX_D_DECL(nullptr,nullptr,nullptr)};
    auto fcent = (factory) ? factory->getFaceCent()
        : Array<const MultiCutFab*,AMREX_SPACEDIM>{AMREX_D_DECL(nullptr,nullptr,nullptr)};
    const MultiCutFab* bcent = (factory) ? &(factory->getBndryCent()) : nullptr;

    const Geometry& geom = m_geom[amrlev][mglev];
    const auto dxinv = geom.InvCellSizeArray();

    Array<MultiFab,AMREX_SPACEDIM>& fluxmf = m_tauflux[amrlev][mglev];
    iMultiFab const& mask = m_cc_mask[amrlev][mglev];
    MultiFab const& etaebmf = *m_eb_b_coeffs[amrlev][mglev];
    MultiFab const& kapebmf = m_eb_kappa[amrlev][mglev];
    Real bscalar = m_b_scalar;

    compCrossTerms(amrlev, mglev, in);

    MFItInfo mfi_info;
    if (Gpu::notInLaunchRegion()) mfi_info.EnableTiling().SetDynamic(true);
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(out, mfi_info); mfi.isValid(); ++mfi)
    {
        const Box& bx = mfi.tilebox();

        auto fabtyp = (flags) ? (*flags)[mfi].getType(bx) : FabType::regular;
        if (fabtyp == FabType::covered) continue;

        Array4<Real> const axfab = out.array(mfi);
        AMREX_D_TERM(Array4<Real const> const fxfab = fluxmf[0].const_array(mfi);,
                     Array4<Real const> const fyfab = fluxmf[1].const_array(mfi);,
                     Array4<Real const> const fzfab = fluxmf[2].const_array(mfi););

        if (fabtyp == FabType::regular)
        {
            AMREX_LAUNCH_HOST_DEVICE_LAMBDA ( bx, tbx,
            {
                mltensor_cross_terms(tbx, axfab, AMREX_D_DECL(fxfab,fyfab,fzfab), dxinv, bscalar);
            });
        }
        else
        {
            Array4<Real const> const& vfab = in.const_array(mfi);
            Array4<Real const> const& etab = etaebmf.const_array(mfi);
            Array4<Real const> const& kapb = kapebmf.const_array(mfi);
            Array4<int const> const& ccm = mask.const_array(mfi);
            Array4<EBCellFlag const> const& flag = flags->const_array(mfi);
            Array4<Real const> const& vol = vfrac->const_array(mfi);
            AMREX_D_TERM(Array4<Real const> const& apx = area[0]->const_array(mfi);,
                         Array4<Real const> const& apy = area[1]->const_array(mfi);,
                         Array4<Real const> const& apz = area[2]->const_array(mfi););
            AMREX_D_TERM(Array4<Real const> const& fcx = fcent[0]->const_array(mfi);,
                         Array4<Real const> const& fcy = fcent[1]->const_array(mfi);,
                         Array4<Real const> const& fcz = fcent[2]->const_array(mfi););
            Array4<Real const> const& bc = bcent->const_array(mfi);

            Array4<Real const> foo;
            const bool is_eb_dirichlet =  isEBDirichlet();
            const bool is_eb_inhomog = m_is_eb_inhomog;
            Array4<Real const> const& velbfab = (is_eb_dirichlet && is_eb_inhomog)
                ? m_eb_phi[amrlev]->const_array(mfi) : foo;

            AMREX_LAUNCH_HOST_DEVICE_LAMBDA ( bx, tbx,
            {
                mlebtensor_cross_terms(tbx, axfab,
                                       AMREX_D_DECL(fxfab,fyfab,fzfab),
                                       vfab, velbfab, etab, kapb, ccm, flag, vol,
                                       AMREX_D_DECL(apx,apy,apz),
                                       AMREX_D_DECL(fcx,fcy,fcz),
                                       bc, is_eb_dirichlet, is_eb_inhomog,
                                       dxinv, bscalar);
            });
        }
    }
}